

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int selectWindowRewriteExprCb(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  Parse *pParse;
  WindowRewrite *pWVar4;
  Window *pWVar5;
  Expr *pExpr_00;
  ExprList *pEVar6;
  WindowRewrite *pWVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  
  pParse = pWalker->pParse;
  pWVar4 = (pWalker->u).pRewrite;
  bVar2 = pExpr->op;
  if (pWVar4->pSubSelect == (Select *)0x0) {
LAB_0019be65:
    if (bVar2 - 0xa2 < 2) {
LAB_0019be70:
      pExpr_00 = sqlite3ExprDup(pParse->db,pExpr,0);
      pEVar6 = sqlite3ExprListAppend(pParse,pWVar4->pSub,pExpr_00);
      pWVar4->pSub = pEVar6;
      iVar9 = 0;
      if (pEVar6 != (ExprList *)0x0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 3);
        *pbVar1 = *pbVar1 | 8;
        sqlite3ExprDeleteNN(pParse->db,pExpr);
        pExpr->op = '\0';
        pExpr->affinity = '\0';
        *(undefined2 *)&pExpr->field_0x2 = 0;
        pExpr->flags = 0;
        (pExpr->u).zToken = (char *)0x0;
        pExpr->iColumn = 0;
        pExpr->iAgg = 0;
        pExpr->iRightJoinTable = 0;
        pExpr->op2 = '\0';
        pExpr->field_0x37 = 0;
        pExpr->pAggInfo = (AggInfo *)0x0;
        (pExpr->y).pTab = (Table *)0x0;
        (pExpr->x).pList = (ExprList *)0x0;
        pExpr->nHeight = 0;
        pExpr->iTable = 0;
        pExpr->pLeft = (Expr *)0x0;
        pExpr->pRight = (Expr *)0x0;
        pExpr->op = 0xa2;
        pExpr->iColumn = (short)pWVar4->pSub->nExpr + -1;
        pExpr->iTable = pWVar4->pWin->iEphCsr;
        pExpr->y = (anon_union_8_3_c79b3df9_for_y)pWVar4->pTab;
        iVar9 = 0;
      }
    }
    else {
      iVar9 = 0;
      if ((bVar2 == 0xa1) && ((pExpr->flags & 0x1000000) != 0)) {
        iVar9 = 1;
        pWVar7 = pWVar4;
        do {
          pWVar5 = pWVar7->pWin;
          if (pWVar5 == (Window *)0x0) goto LAB_0019be70;
          pWVar7 = (WindowRewrite *)&pWVar5->pNextWin;
        } while ((Window *)(pExpr->y).pTab != pWVar5);
      }
    }
  }
  else {
    if (bVar2 == 0xa2) {
      uVar3 = pWVar4->pSrc->nSrc;
      uVar10 = 0;
      uVar8 = 0;
      if (0 < (int)uVar3) {
        uVar8 = (ulong)uVar3;
      }
      piVar11 = &pWVar4->pSrc->a[0].iCursor;
      for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        if (pExpr->iTable == *piVar11) {
          uVar8 = uVar10 & 0xffffffff;
          break;
        }
        piVar11 = piVar11 + 0x1c;
      }
      if ((uint)uVar8 != uVar3) goto LAB_0019be65;
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int selectWindowRewriteExprCb(Walker *pWalker, Expr *pExpr){
  struct WindowRewrite *p = pWalker->u.pRewrite;
  Parse *pParse = pWalker->pParse;

  /* If this function is being called from within a scalar sub-select
  ** that used by the SELECT statement being processed, only process
  ** TK_COLUMN expressions that refer to it (the outer SELECT). Do
  ** not process aggregates or window functions at all, as they belong
  ** to the scalar sub-select.  */
  if( p->pSubSelect ){
    if( pExpr->op!=TK_COLUMN ){
      return WRC_Continue;
    }else{
      int nSrc = p->pSrc->nSrc;
      int i;
      for(i=0; i<nSrc; i++){
        if( pExpr->iTable==p->pSrc->a[i].iCursor ) break;
      }
      if( i==nSrc ) return WRC_Continue;
    }
  }

  switch( pExpr->op ){

    case TK_FUNCTION:
      if( !ExprHasProperty(pExpr, EP_WinFunc) ){
        break;
      }else{
        Window *pWin;
        for(pWin=p->pWin; pWin; pWin=pWin->pNextWin){
          if( pExpr->y.pWin==pWin ){
            assert( pWin->pOwner==pExpr );
            return WRC_Prune;
          }
        }
      }
      /* Fall through.  */

    case TK_AGG_FUNCTION:
    case TK_COLUMN: {
      Expr *pDup = sqlite3ExprDup(pParse->db, pExpr, 0);
      p->pSub = sqlite3ExprListAppend(pParse, p->pSub, pDup);
      if( p->pSub ){
        assert( ExprHasProperty(pExpr, EP_Static)==0 );
        ExprSetProperty(pExpr, EP_Static);
        sqlite3ExprDelete(pParse->db, pExpr);
        ExprClearProperty(pExpr, EP_Static);
        memset(pExpr, 0, sizeof(Expr));

        pExpr->op = TK_COLUMN;
        pExpr->iColumn = p->pSub->nExpr-1;
        pExpr->iTable = p->pWin->iEphCsr;
        pExpr->y.pTab = p->pTab;
      }

      break;
    }

    default: /* no-op */
      break;
  }

  return WRC_Continue;
}